

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&> * __thiscall
Catch::ExprLhs<trng::matrix<trng::GF2,4ul>const&>::operator==
          (BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&>
           *__return_storage_ptr__,ExprLhs<trng::matrix<trng::GF2,4ul>const&> *this,
          matrix<trng::GF2,_4UL> *rhs)

{
  matrix<trng::GF2,_4UL> *pmVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = std::operator==(*(vector<trng::GF2,_std::allocator<trng::GF2>_> **)this,&rhs->data);
  pmVar1 = *(matrix<trng::GF2,_4UL> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002eae20;
  __return_storage_ptr__->m_lhs = pmVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }